

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

uint Curl_cshutdn_add_waitfds(cshutdn *cshutdn,Curl_easy *data,Curl_waitfds *cwfds)

{
  uint uVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn_00;
  connectdata *conn;
  easy_pollset ps;
  Curl_llist_node *e;
  uint need;
  Curl_waitfds *cwfds_local;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  e._4_4_ = 0;
  pCVar2 = Curl_llist_head(&cshutdn->list);
  if (pCVar2 != (Curl_llist_node *)0x0) {
    for (ps._24_8_ = Curl_llist_head(&cshutdn->list); ps._24_8_ != 0;
        ps._24_8_ = Curl_node_next((Curl_llist_node *)ps._24_8_)) {
      conn_00 = (connectdata *)Curl_node_elem((Curl_llist_node *)ps._24_8_);
      memset(&conn,0,0x20);
      Curl_attach_connection(data,conn_00);
      Curl_conn_adjust_pollset(data,conn_00,(easy_pollset *)&conn);
      Curl_detach_connection(data);
      uVar1 = Curl_waitfds_add_ps(cwfds,(easy_pollset *)&conn);
      e._4_4_ = uVar1 + e._4_4_;
    }
  }
  return e._4_4_;
}

Assistant:

unsigned int Curl_cshutdn_add_waitfds(struct cshutdn *cshutdn,
                                      struct Curl_easy *data,
                                      struct Curl_waitfds *cwfds)
{
  unsigned int need = 0;

  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;
    struct easy_pollset ps;
    struct connectdata *conn;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      need += Curl_waitfds_add_ps(cwfds, &ps);
    }
  }
  return need;
}